

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fakeit.hpp
# Opt level: O1

void __thiscall
fakeit::ActionSequence<unsigned_long>::append
          (ActionSequence<unsigned_long> *this,Action<unsigned_long> *action)

{
  shared_ptr<fakeit::Destructible> destructable;
  value_type local_18;
  
  local_18.super___shared_ptr<fakeit::Destructible,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &action->super_Destructible;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<fakeit::Action<unsigned_long>*>
            (&local_18.super___shared_ptr<fakeit::Destructible,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,action);
  std::
  vector<std::shared_ptr<fakeit::Destructible>,_std::allocator<std::shared_ptr<fakeit::Destructible>_>_>
  ::insert(&this->_recordedActions,
           (this->_recordedActions).
           super__Vector_base<std::shared_ptr<fakeit::Destructible>,_std::allocator<std::shared_ptr<fakeit::Destructible>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + -1,&local_18);
  if (local_18.super___shared_ptr<fakeit::Destructible,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_18.super___shared_ptr<fakeit::Destructible,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

void append(Action<R, arglist...> *action) {
            std::shared_ptr<Destructible> destructable{action};
            _recordedActions.insert(_recordedActions.end() - 1, destructable);
        }